

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

vm_prop_id_t __thiscall CVmImageLoader::get_last_prop(CVmImageLoader *this)

{
  vm_val_t ele;
  vm_val_t vec;
  
  vec.typ = VM_OBJ;
  vec.val.obj = G_predef_X.last_prop_obj;
  vm_val_t::ll_index(&vec,&ele,1);
  return ele.val.prop;
}

Assistant:

vm_prop_id_t CVmImageLoader::get_last_prop(VMG0_)
{
    /* get LastPropObj[1] */
    vm_val_t vec, ele;
    vec.set_obj(G_predef->last_prop_obj);
    vec.ll_index(vmg_ &ele, 1);

    /* return the value */
    return ele.val.prop;
}